

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_102615::DiskInterfaceTestStatMissingFile::Run
          (DiskInterfaceTestStatMissingFile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  TimeStamp TVar5;
  RealDiskInterface *this_00;
  char *path;
  string err;
  string local_68;
  string local_48;
  
  pTVar2 = g_current_test;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"nosuchfile","");
  this_00 = &(this->super_DiskInterfaceTest).disk_;
  TVar5 = RealDiskInterface::Stat(this_00,&local_68,&local_48);
  testing::Test::Check
            (pTVar2,TVar5 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
             ,0x35,"0 == disk_.Stat(\"nosuchfile\", &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = g_current_test;
  iVar4 = std::__cxx11::string::compare((char *)&local_48);
  testing::Test::Check
            (pTVar2,iVar4 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
             ,0x36,"\"\" == err");
  pTVar2 = g_current_test;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"nosuchdir/nosuchfile","");
  TVar5 = RealDiskInterface::Stat(this_00,&local_68,&local_48);
  testing::Test::Check
            (pTVar2,TVar5 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
             ,0x3a,"0 == disk_.Stat(\"nosuchdir/nosuchfile\", &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = g_current_test;
  iVar4 = std::__cxx11::string::compare((char *)&local_48);
  path = (char *)(ulong)(iVar4 == 0);
  testing::Test::Check
            (pTVar2,iVar4 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
             ,0x3b,"\"\" == err");
  pTVar2 = g_current_test;
  bVar3 = DiskInterfaceTest::Touch((DiskInterfaceTest *)"notadir",path);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                     ,0x3f,"Touch(\"notadir\")");
  pTVar2 = g_current_test;
  if (bVar3) {
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"notadir/nosuchfile","");
    TVar5 = RealDiskInterface::Stat(this_00,&local_68,&local_48);
    testing::Test::Check
              (pTVar2,TVar5 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0x40,"0 == disk_.Stat(\"notadir/nosuchfile\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    pTVar2 = g_current_test;
    iVar4 = std::__cxx11::string::compare((char *)&local_48);
    testing::Test::Check
              (pTVar2,iVar4 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0x41,"\"\" == err");
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, StatMissingFile) {
  string err;
  EXPECT_EQ(0, disk_.Stat("nosuchfile", &err));
  EXPECT_EQ("", err);

  // On Windows, the errno for a file in a nonexistent directory
  // is different.
  EXPECT_EQ(0, disk_.Stat("nosuchdir/nosuchfile", &err));
  EXPECT_EQ("", err);

  // On POSIX systems, the errno is different if a component of the
  // path prefix is not a directory.
  ASSERT_TRUE(Touch("notadir"));
  EXPECT_EQ(0, disk_.Stat("notadir/nosuchfile", &err));
  EXPECT_EQ("", err);
}